

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderWriter.h
# Opt level: O2

ssize_t __thiscall
aeron::concurrent::logbuffer::HeaderWriter::write
          (HeaderWriter *this,int __fd,void *__buf,size_t __n)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  index_t offset;
  undefined4 in_register_00000034;
  undefined4 in_R8D;
  int64_t dummy;
  
  offset = (index_t)__buf;
  AtomicBuffer::putInt32Ordered
            ((AtomicBuffer *)CONCAT44(in_register_00000034,__fd),offset,-(int)__n);
  puVar2 = ((AtomicBuffer *)CONCAT44(in_register_00000034,__fd))->m_buffer;
  puVar1 = puVar2 + (long)offset + 4;
  puVar1[0] = '\0';
  puVar1[1] = 0xc0;
  puVar1[2] = '\x01';
  puVar1[3] = '\0';
  *(index_t *)(puVar2 + (long)offset + 8) = offset;
  *(HeaderWriter *)(puVar2 + (long)offset + 0xc) = *this;
  *(undefined4 *)(puVar2 + (long)offset + 0x14) = in_R8D;
  return (ssize_t)puVar2;
}

Assistant:

inline void write(AtomicBuffer& termBuffer, util::index_t offset, util::index_t length, std::int32_t termId) const
    {
        termBuffer.putInt32Ordered(offset, -length);
        atomic::release();

        struct DataFrameHeader::DataFrameHeaderDefn* hdr =
            (struct DataFrameHeader::DataFrameHeaderDefn *)(termBuffer.buffer() + offset);

        hdr->version = DataFrameHeader::CURRENT_VERSION;
        hdr->flags = FrameDescriptor::BEGIN_FRAG | FrameDescriptor::END_FRAG;
        hdr->type = DataFrameHeader::HDR_TYPE_DATA;
        hdr->termOffset = offset;
        hdr->sessionId = m_sessionId;
        hdr->streamId = m_streamId;
        hdr->termId = termId;
    }